

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaos.c
# Opt level: O0

void chaos_zones(dw_rom *rom)

{
  uint8_t uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  dw_enemy *pdVar4;
  uint64_t uVar5;
  dw_enemy *pdVar6;
  double dVar7;
  dw_enemy *local_290;
  dw_enemy *low_str_enemy;
  dw_enemy enemies [38];
  int local_1c;
  int local_18;
  int index;
  int zone;
  int i;
  dw_rom *rom_local;
  
  for (index = 0; index < 0x26; index = index + 1) {
    rom->enemies[index].index = (uint16_t)index;
    pdVar4 = enemies + (long)index + -1;
    pdVar6 = rom->enemies + index;
    uVar2._0_1_ = pdVar6->str;
    uVar2._1_1_ = pdVar6->agi;
    uVar2._2_1_ = pdVar6->hp;
    uVar2._3_1_ = pdVar6->pattern;
    uVar2._4_1_ = pdVar6->s_ss_resist;
    uVar2._5_1_ = pdVar6->hr_dodge;
    uVar2._6_2_ = pdVar6->xp;
    pdVar4->gold = (short)uVar2;
    pdVar4->rank = (float)(int)((ulong)uVar2 >> 0x10);
    pdVar4->index = (short)((ulong)uVar2 >> 0x30);
    uVar3._0_2_ = pdVar6->gold;
    uVar3._2_4_ = pdVar6->rank;
    uVar3._6_2_ = pdVar6->index;
    pdVar4 = enemies + index;
    pdVar4->str = (char)(undefined2)uVar3;
    pdVar4->agi = (char)((ulong)uVar3 >> 8);
    pdVar4->hp = (char)((ulong)uVar3 >> 0x10);
    pdVar4->pattern = (char)((ulong)uVar3 >> 0x18);
    pdVar4->s_ss_resist = (char)((ulong)uVar3 >> 0x20);
    pdVar4->hr_dodge = (char)((ulong)uVar3 >> 0x28);
    pdVar4->xp = (short)((ulong)uVar3 >> 0x30);
  }
  qsort(&low_str_enemy,0x26,0x10,compare_enemies);
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    local_290 = (dw_enemy *)0x0;
    for (index = 0; index < 5; index = index + 1) {
      if (local_18 == 0) {
        uVar5 = mt_rand(0,7);
        local_1c = (int)uVar5;
      }
      else {
        uVar5 = mt_rand(0,0xe);
        local_1c = (int)uVar5;
      }
      rom->zones[local_18 * 5 + index] = (uint8_t)enemies[local_1c].xp;
      if ((local_290 == (dw_enemy *)0x0) ||
         (rom->enemies[enemies[local_1c].xp].rank < local_290->rank)) {
        local_290 = rom->enemies + enemies[local_1c].xp;
      }
    }
    if (local_290->hp < 5) {
      uVar1 = local_290->hp;
    }
    else {
      uVar1 = '\x05';
    }
    local_290->hp = uVar1;
    if (local_290->str < 10) {
      uVar1 = local_290->str;
    }
    else {
      uVar1 = '\n';
    }
    local_290->str = uVar1;
    local_290->pattern = '\0';
    dVar7 = mt_rand_double_ranged(1.0,25.0);
    dVar7 = polyfit(dVar7,&mon_xp_fac);
    local_290->xp = (ushort)(int)dVar7 & 0xff;
    local_290->rank = 1.0;
  }
  for (local_18 = 0x10; local_18 < 0x13; local_18 = local_18 + 1) {
    for (index = 0; index < 5; index = index + 1) {
      uVar5 = mt_rand(0x1b,0x24);
      rom->zones[local_18 * 5 + index] = (uint8_t)enemies[uVar5].xp;
    }
  }
  for (index = 0; index < 3; index = index + 1) {
    uVar5 = mt_rand(0x21,0x25);
    rom->spike_table->monster[index] = (uint8_t)enemies[uVar5].xp;
  }
  for (index = 3; index < 8; index = index + 1) {
    uVar5 = mt_rand(0x15,0x20);
    rom->spike_table->monster[index] = (uint8_t)enemies[uVar5].xp;
  }
  return;
}

Assistant:

static void chaos_zones(dw_rom *rom)
{
    int i, zone, index;
    dw_enemy enemies[RED_DRAGON+1];
    dw_enemy *low_str_enemy = NULL;

    /* set up an array to sort enemies by difficulty */
    for (i=SLIME; i <= RED_DRAGON; i++) {
        rom->enemies[i].index = i;
        enemies[i] = rom->enemies[i];
    }
    qsort(enemies, RED_DRAGON+1, sizeof(dw_enemy), &compare_enemies);

    /* randomize zones 0-2 again with weaker monsters */
    for (zone=0; zone <= 2; zone++) {
        low_str_enemy = NULL;
        for (i=0; i < 5; i++) {
            if (!zone)
                index = mt_rand(0,7);
            else
                index = mt_rand(0, 14);

            rom->zones[zone * 5 + i] = enemies[index].index;
            /* Find the enemy in zones 0-2 with the lowest strength */
            if (!low_str_enemy ||
                    rom->enemies[enemies[index].index].rank < low_str_enemy->rank) {
                low_str_enemy = &rom->enemies[enemies[index].index];
            }
        }
        /* ensure that at least one enemy in these zones is beatable */
        /* set the lowest strength enemy's HP to a max of 5. */
        low_str_enemy->hp = MIN(low_str_enemy->hp, 5);
        low_str_enemy->str = MIN(low_str_enemy->str, 10);
        /* remove any abilities */
        low_str_enemy->pattern = 0;
        /* constrict the xp value so it can't be abused */
        low_str_enemy->xp =
            (uint8_t)polyfit(mt_rand_double_ranged(1, 25), &mon_xp_fac);
        low_str_enemy->rank = 1.0;

    }
    /* randomize Charlock Zones */
    for (zone=16; zone <= 18; zone++) {
        for (i=0; i < 5; i++) {
            rom->zones[zone * 5 + i] = enemies[mt_rand(27, 36)].index;
        }
    }

    for (i=0; i < 3; i++) { /* randomize the forced encounters */
        rom->spike_table->monster[i] = enemies[mt_rand(33, 37)].index;
    }
    for (i=3; i < 8; i++) { /* randomize the forced encounters */
        rom->spike_table->monster[i] = enemies[mt_rand(21, 32)].index;
    }
}